

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianProbitRegressor.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::BayesianProbitRegressor_FeatureWeight::BayesianProbitRegressor_FeatureWeight
          (BayesianProbitRegressor_FeatureWeight *this,BayesianProbitRegressor_FeatureWeight *from)

{
  BayesianProbitRegressor_FeatureWeight *from_local;
  BayesianProbitRegressor_FeatureWeight *this_local;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite);
  (this->super_MessageLite)._vptr_MessageLite =
       (_func_int **)&PTR__BayesianProbitRegressor_FeatureWeight_006fb960;
  google::protobuf::
  RepeatedPtrField<CoreML::Specification::BayesianProbitRegressor_FeatureValueWeight>::
  RepeatedPtrField(&this->weights_,&from->weights_);
  google::protobuf::internal::CachedSize::CachedSize(&this->_cached_size_);
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(from->super_MessageLite)._internal_metadata_);
  this->featureid_ = from->featureid_;
  return;
}

Assistant:

BayesianProbitRegressor_FeatureWeight::BayesianProbitRegressor_FeatureWeight(const BayesianProbitRegressor_FeatureWeight& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite(),
      weights_(from.weights_) {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  featureid_ = from.featureid_;
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.BayesianProbitRegressor.FeatureWeight)
}